

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v4.cc
# Opt level: O3

GMshFileV4 *
lf::io::ReadGmshFileV4
          (GMshFileV4 *__return_storage_ptr__,const_iterator begin,const_iterator end,
          string *version,bool is_binary,int size_t_size,int one,string *filename)

{
  pointer pPVar1;
  bool bVar2;
  int iVar3;
  runtime_error *prVar4;
  PeriodicLink *p;
  pointer pPVar5;
  stringstream ss;
  string local_218;
  string local_1f8;
  string local_1d8;
  TriangularView<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_10U> local_1b8 [2];
  ostream local_1a8 [376];
  
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (version,"4.1");
  if (iVar3 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Only version 4.1 is supported so far",0x24);
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"version == \"4.1\"","");
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_file_v4.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_218,&local_1f8,0x135,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"this code should not be reached");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (size_t_size == 8) {
    (__return_storage_ptr__->version_number)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->version_number).field_2;
    *(undefined4 *)&(__return_storage_ptr__->version_number).field_2 = 0x312e34;
    (__return_storage_ptr__->version_number)._M_string_length = 3;
    __return_storage_ptr__->is_binary = false;
    __return_storage_ptr__->size_t_size = 8;
    memset(&__return_storage_ptr__->physical_names,0,0xf8);
    (__return_storage_ptr__->nodes).num_nodes = 0xffffffffffffffff;
    memset(&(__return_storage_ptr__->nodes).min_node_tag,0,0x88);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&__return_storage_ptr__->version_number,version);
    __return_storage_ptr__->is_binary = is_binary;
    __return_storage_ptr__->size_t_size = 8;
    if (is_binary) {
      bVar2 = detail::ParseGmshFileV4Binary(begin,end,one,__return_storage_ptr__);
    }
    else {
      bVar2 = detail::ParseGmshFileV4Text(begin,end,__return_storage_ptr__);
    }
    if (bVar2 != false) {
      pPVar5 = (__return_storage_ptr__->periodic_links).
               super__Vector_base<lf::io::GMshFileV4::PeriodicLink,_std::allocator<lf::io::GMshFileV4::PeriodicLink>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar1 = (__return_storage_ptr__->periodic_links).
               super__Vector_base<lf::io::GMshFileV4::PeriodicLink,_std::allocator<lf::io::GMshFileV4::PeriodicLink>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pPVar5 != pPVar1) {
        do {
          if ((pPVar5->affine_transform).
              super__Optional_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_false,_false>._M_payload.
              super__Optional_payload_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>._M_engaged == true
             ) {
            local_218._M_dataplus._M_p = (pointer)&pPVar5->affine_transform;
            local_1b8[0].m_matrix = (MatrixTypeNested)local_218._M_dataplus._M_p;
            Eigen::internal::
            Assignment<Eigen::TriangularView<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_10U>,_Eigen::TriangularView<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_10U>,_Eigen::internal::swap_assign_op<double>,_Eigen::internal::Triangular2Triangular,_void>
            ::run(local_1b8,
                  (TriangularView<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_10U> *)
                  &local_218,(swap_assign_op<double> *)&local_1f8);
          }
          pPVar5 = pPVar5 + 1;
        } while (pPVar5 != pPVar1);
      }
      return __return_storage_ptr__;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Could not parse file ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(filename->_M_dataplus)._M_p,filename->_M_string_length);
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"succesful","");
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_file_v4.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_218,&local_1f8,0x145,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"this code should not be reached");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"size of size_t must be ",0x17);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_218,"size_t_size == sizeof(std::size_t)","");
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_file_v4.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_218,&local_1f8,0x137,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,"this code should not be reached");
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

GMshFileV4 ReadGmshFileV4(std::string::const_iterator begin,
                          std::string::const_iterator end,
                          const std::string& version, bool is_binary,
                          int size_t_size, int one,
                          const std::string& filename) {
  LF_VERIFY_MSG(version == "4.1", "Only version 4.1 is supported so far");
  LF_VERIFY_MSG(size_t_size == sizeof(std::size_t),
                "size of size_t must be " << sizeof(std::size_t));

  GMshFileV4 result;
  result.version_number = version;
  result.is_binary = is_binary;
  result.size_t_size = size_t_size;

  bool succesful = false;
  if (!is_binary) {
    succesful = detail::ParseGmshFileV4Text(begin, end, &result);
  } else {
    succesful = detail::ParseGmshFileV4Binary(begin, end, one, &result);
  }

  LF_VERIFY_MSG(succesful, "Could not parse file " << filename);
  // LF_VERIFY_MSG(iter == end, "Could not parse all of file " << filename);

  // transpose all periodic matrices because they are read in column-first mode
  // but gmsh writes them in row-first mode
  for (auto& p : result.periodic_links) {
    if (p.affine_transform) {
      p.affine_transform->transposeInPlace();
    }
  }

  return result;
}